

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

wchar_t square_trap_timeout(chunk_conflict2 *c,loc_conflict grid,wchar_t t_idx)

{
  trap *ptVar1;
  square_conflict *psVar2;
  trap *next_trap;
  trap *current_trap;
  wchar_t t_idx_local;
  chunk_conflict2 *c_local;
  loc_conflict grid_local;
  
  psVar2 = square((chunk *)c,grid);
  ptVar1 = psVar2->trap;
  do {
    while( true ) {
      next_trap = ptVar1;
      if (next_trap == (trap *)0x0) {
        return L'\0';
      }
      ptVar1 = next_trap->next;
      if ((t_idx < L'\0') || (t_idx == (uint)next_trap->t_idx)) break;
      if (ptVar1 == (trap *)0x0) {
        return L'\0';
      }
    }
  } while (next_trap->timeout == '\0');
  return (uint)next_trap->timeout;
}

Assistant:

int square_trap_timeout(struct chunk *c, struct loc grid, int t_idx)
{
	struct trap *current_trap = square(c, grid)->trap;
	while (current_trap) {
		/* Get the next trap (may be NULL) */
		struct trap *next_trap = current_trap->next;

		/* If called with a specific index, skip others */
		if ((t_idx >= 0) && (t_idx != current_trap->t_idx)) {
			if (!next_trap) break;
			current_trap = next_trap;
			continue;
		}

		/* If the timer is set, return the value */
		if (current_trap->timeout)
			return current_trap->timeout;

		/* Replace with the next trap */
		current_trap = next_trap;
    }

	return 0;
}